

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

ON_Font * __thiscall
ON_FontList::FromFamilyName
          (ON_FontList *this,wchar_t *family_name,wchar_t *prefered_face_name,Weight prefered_weight
          ,Stretch prefered_stretch,Style prefered_style)

{
  ON_Font *pOVar1;
  
  pOVar1 = Internal_FromNames(this,(wchar_t *)0x0,(wchar_t *)0x0,family_name,prefered_face_name,
                              prefered_weight,prefered_stretch,prefered_style,false,false,false,
                              false,false,0.0);
  return pOVar1;
}

Assistant:

const ON_Font* ON_FontList::FromFamilyName(
  const wchar_t* family_name,
  const wchar_t* prefered_face_name,
  ON_Font::Weight prefered_weight,
  ON_Font::Stretch prefered_stretch,
  ON_Font::Style prefered_style
) const
{
  return FromNames(
    nullptr,
    nullptr,
    family_name,
    prefered_face_name,
    prefered_weight,
    prefered_stretch,
    prefered_style,
    false,
    false
  );
}